

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadTime(ON_BinaryArchive *this,tm *utc)

{
  bool local_19;
  bool rc;
  tm *utc_local;
  ON_BinaryArchive *this_local;
  
  local_19 = ReadInt(this,&utc->tm_sec);
  if (local_19) {
    local_19 = ReadInt(this,&utc->tm_min);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_hour);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_mday);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_mon);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_year);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_wday);
  }
  if (local_19 != false) {
    local_19 = ReadInt(this,&utc->tm_yday);
  }
  if (local_19 != false) {
    if ((utc->tm_sec < 0) || (0x3c < utc->tm_sec)) {
      local_19 = false;
    }
    if ((utc->tm_min < 0) || (0x3c < utc->tm_min)) {
      local_19 = false;
    }
    if ((utc->tm_hour < 0) || (0x18 < utc->tm_hour)) {
      local_19 = false;
    }
    if ((utc->tm_mday < 0) || (0x1f < utc->tm_mday)) {
      local_19 = false;
    }
    if ((utc->tm_mon < 0) || (0xc < utc->tm_mon)) {
      local_19 = false;
    }
    if ((utc->tm_wday < 0) || (7 < utc->tm_wday)) {
      local_19 = false;
    }
    if ((utc->tm_yday < 0) || (0x16e < utc->tm_yday)) {
      local_19 = false;
    }
    if (local_19 == false) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x5db,"","ON_BinaryArchive::ReadTime() - bad time in archive");
    }
  }
  return local_19;
}

Assistant:

bool
ON_BinaryArchive::ReadTime( struct tm& utc )
{
  // utc = coordinated universal time ( a.k.a GMT, UTC )
  // (From ANSI C time() and gmtime().)
  bool rc = ReadInt( &utc.tm_sec );
  if ( rc )
    rc = ReadInt( &utc.tm_min );
  if ( rc )
    rc = ReadInt( &utc.tm_hour );
  if ( rc )
    rc = ReadInt( &utc.tm_mday );
  if ( rc )
    rc = ReadInt( &utc.tm_mon );
  if ( rc )
    rc = ReadInt( &utc.tm_year );
  if ( rc )
    rc = ReadInt( &utc.tm_wday );
  if ( rc )
    rc = ReadInt( &utc.tm_yday );
  if ( rc ) {
    if ( utc.tm_sec < 0 || utc.tm_sec > 60 )
      rc = false;
    if ( utc.tm_min < 0 || utc.tm_min > 60 )
      rc = false;
    if ( utc.tm_hour < 0 || utc.tm_hour > 24 )
      rc = false;
    if ( utc.tm_mday < 0 || utc.tm_mday > 31 )
      rc = false;
    if ( utc.tm_mon < 0 || utc.tm_mon > 12 )
      rc = false;
    // no year restrictions because dates are used in archeological userdata
    if ( utc.tm_wday < 0 || utc.tm_wday > 7 )
      rc = false;
    if ( utc.tm_yday < 0 || utc.tm_yday > 366 )
      rc = false;
    if ( !rc ) {
      ON_ERROR("ON_BinaryArchive::ReadTime() - bad time in archive");
    }
  }
  return rc;
}